

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

string * piksel::readFile(string *__return_storage_ptr__,string *filename)

{
  stringstream ss;
  ostream local_388 [376];
  ifstream ifs;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&ifs,(filename->_M_dataplus)._M_p,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string readFile(const std::string& filename) {
    std::ifstream ifs(filename.c_str());
    std::stringstream ss;
    ss << ifs.rdbuf();
    return ss.str();
}